

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3GetUInt32(char *z,u32 *pI)

{
  uint uVar1;
  ulong uVar2;
  u32 uVar3;
  byte bVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  u32 uVar8;
  
  bVar4 = *z;
  uVar5 = (ulong)bVar4;
  uVar2 = uVar5 - 0x30;
  uVar3 = 0;
  if (uVar2 < 10) {
    pbVar6 = (byte *)(z + 1);
    uVar8 = 0;
    uVar7 = 0;
    do {
      uVar7 = ((long)(char)uVar5 + uVar7 * 10) - 0x30;
      if (0x100000000 < uVar7) {
        uVar1 = 0;
        goto LAB_0016af05;
      }
      bVar4 = *pbVar6;
      uVar5 = (ulong)bVar4;
      pbVar6 = pbVar6 + 1;
    } while (0xfffffffffffffff5 < uVar5 - 0x3a);
  }
  else {
    uVar7 = 0;
  }
  if (bVar4 == 0 && uVar2 < 10) {
    uVar3 = (u32)uVar7;
  }
  uVar1 = (uint)(bVar4 == 0 && uVar2 < 10);
  uVar8 = uVar3;
LAB_0016af05:
  *pI = uVar8;
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetUInt32(const char *z, u32 *pI){
  u64 v = 0;
  int i;
  for(i=0; sqlite3Isdigit(z[i]); i++){
    v = v*10 + z[i] - '0';
    if( v>4294967296LL ){ *pI = 0; return 0; }
  }
  if( i==0 || z[i]!=0 ){ *pI = 0; return 0; }
  *pI = (u32)v;
  return 1;
}